

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

bool __thiscall QGraphicsSceneBspTreeIndex::event(QGraphicsSceneBspTreeIndex *this,QEvent *event)

{
  TimerId TVar1;
  QGraphicsSceneBspTreeIndexPrivate *this_00;
  undefined1 uVar2;
  
  if (*(short *)(event + 8) == 1) {
    this_00 = *(QGraphicsSceneBspTreeIndexPrivate **)(this + 8);
    TVar1 = (this_00->indexTimer).m_id;
    if ((TVar1 != Invalid) && (*(TimerId *)(event + 0x10) == TVar1)) {
      if (this_00->restartIndexTimer == true) {
        this_00->restartIndexTimer = false;
      }
      else {
        QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex(this_00);
      }
    }
  }
  uVar2 = QObject::event((QEvent *)this);
  return (bool)uVar2;
}

Assistant:

bool QGraphicsSceneBspTreeIndex::event(QEvent *event)
{
    Q_D(QGraphicsSceneBspTreeIndex);
    if (event->type() == QEvent::Timer) {
            if (d->indexTimer.isActive() && static_cast<QTimerEvent *>(event)->id() == d->indexTimer.id()) {
                if (d->restartIndexTimer) {
                    d->restartIndexTimer = false;
                } else {
                    // this call will kill the timer
                    d->_q_updateIndex();
                }
            }
    }
    return QObject::event(event);
}